

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O2

int tool_write_headers(HdrCbData *hdrcbdata,FILE *stream)

{
  curl_slist *pcVar1;
  char *__s;
  size_t __n;
  size_t sVar2;
  int iVar3;
  curl_slist **ppcVar4;
  curl_slist **ppcVar5;
  
  ppcVar5 = &hdrcbdata->headlist;
  ppcVar4 = ppcVar5;
  do {
    pcVar1 = *ppcVar4;
    if (pcVar1 == (curl_slist *)0x0) {
      iVar3 = 0;
      goto LAB_0010b113;
    }
    __s = pcVar1->data;
    __n = strlen(__s);
    sVar2 = fwrite(__s,1,__n,(FILE *)stream);
    ppcVar4 = &pcVar1->next;
  } while (__n == sVar2);
  iVar3 = 1;
LAB_0010b113:
  curl_slist_free_all(*ppcVar5);
  *ppcVar5 = (curl_slist *)0x0;
  return iVar3;
}

Assistant:

int tool_write_headers(struct HdrCbData *hdrcbdata, FILE *stream)
{
  struct curl_slist *h = hdrcbdata->headlist;
  int rc = 1;
  while(h) {
    /* not "handled", just show it */
    size_t len = strlen(h->data);
    if(len != fwrite(h->data, 1, len, stream))
      goto fail;
    h = h->next;
  }
  rc = 0; /* success */
fail:
  curl_slist_free_all(hdrcbdata->headlist);
  hdrcbdata->headlist = NULL;
  return rc;
}